

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O2

void __thiscall UniValue::clear(UniValue *this)

{
  this->typ = VNULL;
  (this->val)._M_string_length = 0;
  *(this->val)._M_dataplus._M_p = '\0';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->keys);
  std::vector<UniValue,_std::allocator<UniValue>_>::clear(&this->values);
  return;
}

Assistant:

void UniValue::clear()
{
    typ = VNULL;
    val.clear();
    keys.clear();
    values.clear();
}